

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

void xmlDumpNotationTable(xmlBufferPtr buf,xmlNotationTablePtr table)

{
  xmlFreeFunc p_Var1;
  xmlParserErrors xVar2;
  xmlSaveCtxtPtr ctxt;
  xmlChar *pxVar3;
  
  if (table != (xmlNotationTablePtr)0x0 && buf != (xmlBufferPtr)0x0) {
    ctxt = xmlSaveToBuffer(buf,(char *)0x0,0);
    xmlSaveNotationTable(ctxt,table);
    xVar2 = xmlSaveFinish(ctxt);
    p_Var1 = xmlFree;
    if (xVar2 != XML_ERR_OK) {
      pxVar3 = xmlBufferDetach(buf);
      (*p_Var1)(pxVar3);
      return;
    }
  }
  return;
}

Assistant:

void
xmlDumpNotationTable(xmlBufferPtr buf, xmlNotationTablePtr table) {
    xmlSaveCtxtPtr save;

    if ((buf == NULL) || (table == NULL))
        return;

    save = xmlSaveToBuffer(buf, NULL, 0);
    xmlSaveNotationTable(save, table);
    if (xmlSaveFinish(save) != XML_ERR_OK)
        xmlFree(xmlBufferDetach(buf));
}